

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte bVar1;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  __p;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  pointer __p_00;
  int64_t iVar5;
  ValueLength VVar6;
  iterator __it;
  Exception *pEVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  pointer puVar11;
  ValueLength VVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  pointer ptr_00;
  uint8_t *start;
  byte *pbVar16;
  ulong uVar17;
  bool bVar18;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  _Stack_108;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  _Stack_100;
  uint8_t *puStack_f8;
  long lStack_f0;
  Validator *pVStack_e8;
  pointer puStack_e0;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Stack_d8;
  ValueLength VStack_d0;
  pointer puStack_c8;
  unsigned_long uStack_c0;
  unsigned_long auStack_b8 [11];
  undefined8 uStack_60;
  byte *pbStack_50;
  byte *pbStack_48;
  Validator *pVStack_40;
  byte *pbStack_38;
  
  if (*ptr == '\x14') {
    uStack_60 = 0x103cda;
    validateBufferLength(this,5,length,true);
    pbStack_50 = ptr + 1;
    uStack_60 = 0x103cf2;
    VVar12 = ReadVariableLengthValue<false>(&pbStack_50,ptr + length + 1);
    pbVar16 = pbStack_50;
    if ((VVar12 <= length) && (4 < VVar12)) {
      pbStack_50 = ptr + (VVar12 - 1);
      uStack_60 = 0x103d1f;
      VVar12 = ReadVariableLengthValue<true>(&pbStack_50,ptr + VVar12);
      if (VVar12 != 0) {
        pbVar15 = pbStack_50 + 1;
        pbStack_50 = pbVar16;
        pVStack_40 = this;
        while (bVar18 = VVar12 != 0, VVar12 = VVar12 - 1, bVar18) {
          if (pbVar15 <= pbVar16) {
            uStack_60 = 0x103e22;
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            pcVar10 = "Object items number is out of bounds";
            goto LAB_00103e40;
          }
          uStack_60 = 0x103d68;
          validatePart(this,pbVar16,(long)pbVar15 - (long)pbVar16,true);
          bVar1 = *pbVar16;
          pbStack_48 = pbVar16;
          if (0x7f < (ulong)bVar1 - 0x40) {
            if ((bVar1 & 0xf0) == 0x30) {
              uStack_60 = 0x103d92;
              iVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_48);
              if (iVar5 < 1) {
LAB_00103e2e:
                uStack_60 = 0x103e36;
                pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                pcVar10 = "Invalid object key type";
                goto LAB_00103e40;
              }
            }
            else if ((bVar1 & 0xf8) != 0x28) goto LAB_00103e2e;
          }
          uStack_60 = 0x103db0;
          VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &pbStack_48);
          this = pVStack_40;
          if (((ulong)bVar1 - 0x40 < 0x80) && (pVStack_40->options->validateUtf8Strings == true)) {
            uStack_60 = 0x103dd9;
            validatePart(pVStack_40,pbVar16,VVar6,true);
          }
          pbVar16 = pbVar16 + VVar6;
          uStack_60 = 0x103def;
          validatePart(this,pbVar16,(long)pbVar15 - (long)pbVar16,true);
          uStack_60 = 0x103dfe;
          pbStack_38 = pbVar16;
          VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &pbStack_38);
          pbVar16 = pbVar16 + VVar6;
        }
        if (pbVar16 == pbVar15) {
          return;
        }
        uStack_60 = 0x103e7d;
        pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar10 = "Object has more members than specified";
        goto LAB_00103e40;
      }
    }
    uStack_60 = 0x103e69;
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar10 = "Object length value is out of bounds";
LAB_00103e40:
    uStack_60 = 0x103e4b;
    Exception::Exception(pEVar7,ValidatorInvalidLength,pcVar10);
    uStack_60 = 0x103e61;
    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
  }
  if (7 < (byte)(*ptr - 0xb)) {
    return;
  }
  bVar1 = *ptr;
  lStack_f0 = ((ulong)((ulong)bVar1 < 0xf) << 2 | 0xfffffffffffffff1) + (ulong)bVar1;
  VVar12 = 1L << ((byte)lStack_f0 & 0x3f);
  pVStack_e8 = this;
  validateBufferLength(this,(2L << ((byte)lStack_f0 & 0x3f)) + 2,length,true);
  uVar2 = readIntegerNonEmpty<unsigned_long>(ptr + 1,VVar12);
  if (length < uVar2) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar10 = "Object length is out of bounds";
    goto LAB_001043ed;
  }
  puStack_f8 = ptr;
  if ((bVar1 == 0x12) || (bVar1 == 0xe)) {
    ptr_00 = (pointer)(ptr + uVar2);
    uVar3 = readIntegerNonEmpty<unsigned_long>((uint8_t *)((long)ptr_00 - VVar12),VVar12);
    if (uVar3 == 0) goto LAB_00104380;
    puStack_e0 = (pointer)((uint8_t *)((long)ptr_00 - VVar12) + -(uVar3 << ((byte)lStack_f0 & 0x3f))
                          );
    if ((pointer)(ptr + VVar12) <= puStack_e0) {
      puVar11 = (pointer)(puStack_f8 + VVar12 * -2 + length);
LAB_00103ff4:
      if (puStack_e0 <= puVar11) {
        _Stack_d8._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
             (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
        _Stack_100._M_head_impl =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x0;
        __p_00 = auStack_b8;
        if (0x10 < uVar3) {
          if (uVar3 < 0x81) {
            __p_00 = (pointer)operator_new__(uVar3 * 8);
            std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
                      (&_Stack_d8,__p_00);
          }
          else {
            std::
            make_unique<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
                      ();
            __p._M_head_impl = _Stack_108._M_head_impl;
            _Stack_108._M_head_impl = (pointer)0x0;
            std::
            __uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ::reset((__uniq_ptr_impl<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     *)&_Stack_100,__p._M_head_impl);
            std::
            unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)&_Stack_108);
          }
        }
        uVar17 = 0;
        VStack_d0 = VVar12;
        do {
          VVar12 = VStack_d0;
          if (puStack_e0 <= ptr_00) {
            if (uVar17 < uVar3) {
              pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception
                        (pEVar7,ValidatorInvalidLength,"Object has fewer items than in index");
              __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
            }
            bVar1 = (byte)lStack_f0;
            if (uVar3 < 0x81) {
              for (uVar17 = 0; uVar17 != uVar3; uVar17 = uVar17 + 1) {
                uVar2 = readIntegerNonEmpty<unsigned_long>
                                  ((uint8_t *)
                                   ((long)&(puStack_e0->_M_h)._M_buckets +
                                   (uVar17 << (bVar1 & 0x3f))),VVar12);
                uVar14 = 0;
                uVar13 = uVar3;
                while( true ) {
                  uVar9 = uVar13;
                  if (uVar9 <= uVar14) {
                    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                    Exception::Exception
                              (pEVar7,ValidatorInvalidLength,"Object has invalid index offset");
                    __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
                  }
                  uVar13 = uVar9 + uVar14 >> 1;
                  if (uVar2 == __p_00[uVar13]) break;
                  if (__p_00[uVar13] <= uVar2) {
                    uVar14 = uVar13 + 1;
                    uVar13 = uVar9;
                  }
                }
              }
            }
            else {
              for (uVar17 = 0; uVar3 != uVar17; uVar17 = uVar17 + 1) {
                _Stack_108._M_head_impl =
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)readIntegerNonEmpty<unsigned_long>
                                  ((uint8_t *)
                                   ((long)&(puStack_e0->_M_h)._M_buckets +
                                   (uVar17 << (bVar1 & 0x3f))),VVar12);
                __it = std::
                       _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&(_Stack_100._M_head_impl)->_M_h,(key_type *)&_Stack_108);
                if (__it.super__Node_iterator_base<unsigned_long,_false>._M_cur ==
                    (__node_type *)0x0) {
                  pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                  Exception::Exception
                            (pEVar7,ValidatorInvalidLength,"Object has invalid index offset");
                  __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
                }
                std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::erase(&(_Stack_100._M_head_impl)->_M_h,
                        (const_iterator)__it.super__Node_iterator_base<unsigned_long,_false>._M_cur)
                ;
              }
            }
            std::
            unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                           *)&_Stack_100);
            std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                      ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                       &_Stack_d8);
            return;
          }
          validatePart(pVStack_e8,(uint8_t *)ptr_00,(long)puStack_e0 - (long)ptr_00,true);
          bVar1 = *(byte *)&(ptr_00->_M_h)._M_buckets;
          _Stack_108._M_head_impl = ptr_00;
          if (0x7f < (ulong)bVar1 - 0x40) {
            if ((bVar1 & 0xf0) == 0x30) {
              iVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&_Stack_108);
              if (iVar5 < 1) {
LAB_001042ff:
                pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception(pEVar7,ValidatorInvalidLength,"Invalid object key type");
                __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
              }
            }
            else if ((bVar1 & 0xf8) != 0x28) goto LAB_001042ff;
          }
          VVar12 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&_Stack_108);
          if (((ulong)bVar1 - 0x40 < 0x80) && (pVStack_e8->options->validateUtf8Strings == true)) {
            validatePart(pVStack_e8,(uint8_t *)ptr_00,VVar12,true);
          }
          puVar11 = (pointer)((long)&(ptr_00->_M_h)._M_buckets + VVar12);
          if (puStack_e0 <= puVar11) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar7,ValidatorInvalidLength,"Object value leaking into index table");
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
          validatePart(pVStack_e8,(uint8_t *)puVar11,(long)puStack_e0 - (long)puVar11,true);
          uStack_c0 = (long)ptr_00 - (long)puStack_f8;
          if (uVar3 < 0x81) {
            __p_00[uVar17] = uStack_c0;
          }
          else {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)_Stack_100._M_head_impl,&uStack_c0);
          }
          puStack_c8 = puVar11;
          VVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &puStack_c8);
          uVar17 = uVar17 + 1;
          if (uVar3 < uVar17) {
            pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar7,ValidatorInvalidLength,
                       "Object value has more key/value pairs than announced");
            __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
          }
          ptr_00 = (pointer)((long)&(ptr_00->_M_h)._M_buckets + VVar6 + VVar12);
        } while( true );
      }
    }
  }
  else {
    start = ptr + 1 + VVar12;
    uVar3 = readIntegerNonEmpty<unsigned_long>(start,VVar12);
    if (uVar3 == 0) {
LAB_00104380:
      pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Object nrItems value is invalid";
      goto LAB_001043ed;
    }
    lVar4 = -2L << ((byte)lStack_f0 & 0x3f);
    puStack_e0 = (pointer)(puStack_f8 + uVar2);
    puVar11 = (pointer)(start + lVar4 + VVar12 + 8);
    if (puStack_e0 < (pointer)(start + lVar4 + VVar12 + 8)) {
      puVar11 = puStack_e0;
    }
    lVar8 = 0;
    while ((ptr_00 = (pointer)(start + lVar8 + VVar12), ptr_00 < puVar11 &&
           (*(uint8_t *)&(ptr_00->_M_h)._M_buckets == '\0'))) {
      lVar8 = lVar8 + 1;
    }
    if ((lVar8 != 0) && (lVar4 + 8 != lVar8)) {
      pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Object padding is invalid";
      goto LAB_001043ed;
    }
    puStack_e0 = (pointer)((long)puStack_e0 - (uVar3 << ((byte)lStack_f0 & 0x3f)));
    if (((pointer)(puStack_f8 + VVar12 * 2) <= puStack_e0) && (ptr_00 <= puStack_e0)) {
      puVar11 = (pointer)(puStack_f8 + (length - VVar12));
      goto LAB_00103ff4;
    }
  }
  pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
  pcVar10 = "Object index table is out of bounds";
LAB_001043ed:
  Exception::Exception(pEVar7,ValidatorInvalidLength,pcVar10);
  __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateObject(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x14U) {
    // compact object
    validateCompactObject(ptr, length);
  } else if (head >= 0x0bU && head <= 0x12U) {
    // regular object
    validateIndexedObject(ptr, length);
  } else if (head == 0x0aU) {
    // empty object. always valid
  }
}